

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O1

int cram_byte_array_stop_encode(cram_slice *slice,cram_codec *c,char *in,int in_size)

{
  uchar uVar1;
  size_t sVar2;
  uchar *puVar3;
  cram_block *pcVar4;
  ulong uVar5;
  size_t sVar6;
  size_t __size;
  ulong uVar7;
  size_t sVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  
  sVar8 = (size_t)in_size;
  pcVar4 = c->out;
  uVar7 = pcVar4->alloc;
  sVar6 = pcVar4->byte;
  if (uVar7 <= sVar6 + sVar8) {
    do {
      auVar9._8_4_ = (int)(uVar7 >> 0x20);
      auVar9._0_8_ = uVar7;
      auVar9._12_4_ = 0x45300000;
      dVar11 = ((auVar9._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) * 1.5;
      uVar5 = (ulong)dVar11;
      __size = (long)(dVar11 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5;
      if (uVar7 == 0) {
        __size = 0x400;
      }
      pcVar4->alloc = __size;
      puVar3 = (uchar *)realloc(pcVar4->data,__size);
      pcVar4 = c->out;
      pcVar4->data = puVar3;
      uVar7 = pcVar4->alloc;
      sVar6 = pcVar4->byte;
    } while (uVar7 <= sVar6 + sVar8);
  }
  memcpy(pcVar4->data + sVar6,in,sVar8);
  pcVar4 = c->out;
  uVar5 = pcVar4->alloc;
  sVar2 = pcVar4->byte;
  sVar6 = sVar2 + sVar8;
  pcVar4->byte = sVar6;
  uVar7 = sVar2 + sVar8 + 1;
  if (uVar5 <= uVar7) {
    do {
      auVar10._8_4_ = (int)(uVar5 >> 0x20);
      auVar10._0_8_ = uVar5;
      auVar10._12_4_ = 0x45300000;
      dVar11 = ((auVar10._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) * 1.5;
      uVar7 = (ulong)dVar11;
      sVar8 = (long)(dVar11 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7;
      if (uVar5 == 0) {
        sVar8 = 0x400;
      }
      pcVar4->alloc = sVar8;
      puVar3 = (uchar *)realloc(pcVar4->data,sVar8);
      pcVar4 = c->out;
      pcVar4->data = puVar3;
      uVar5 = pcVar4->alloc;
      sVar6 = pcVar4->byte;
      uVar7 = sVar6 + 1;
    } while (uVar5 <= uVar7);
  }
  uVar1 = (c->field_6).byte_array_stop.stop;
  pcVar4->byte = uVar7;
  pcVar4->data[sVar6] = uVar1;
  return 0;
}

Assistant:

int cram_byte_array_stop_encode(cram_slice *slice, cram_codec *c,
				char *in, int in_size) {
    BLOCK_APPEND(c->out, in, in_size);
    BLOCK_APPEND_CHAR(c->out, c->e_byte_array_stop.stop);
    return 0;
}